

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEditPrivate::updateEdit(QDateTimeEditPrivate *this)

{
  QLineEdit *this_00;
  int length;
  bool bVar1;
  char cVar2;
  int iVar3;
  P _a;
  P _b;
  long lVar4;
  bool bVar5;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QAbstractSpinBoxPrivate::specialValue(&this->super_QAbstractSpinBoxPrivate);
  if (bVar1) {
    local_58.d.d = (this->super_QAbstractSpinBoxPrivate).specialValueText.d.d;
    local_58.d.ptr = (this->super_QAbstractSpinBoxPrivate).specialValueText.d.ptr;
    local_58.d.size = (this->super_QAbstractSpinBoxPrivate).specialValueText.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xd8))
              (&local_58,this,&(this->super_QAbstractSpinBoxPrivate).value);
  }
  (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
            (&local_70,this);
  if ((undefined1 *)local_58.d.size ==
      (undefined1 *)CONCAT44(local_70.d.size._4_4_,(int)local_70.d.size)) {
    QVar7.m_data = local_58.d.ptr;
    QVar7.m_size = local_58.d.size;
    QVar8.m_data = local_70.d.ptr;
    QVar8.m_size = local_58.d.size;
    cVar2 = QtPrivate::equalStrings(QVar7,QVar8);
  }
  else {
    cVar2 = '\0';
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (cVar2 == '\0') {
    QLineEdit::selectedText(&local_70,(this->super_QAbstractSpinBoxPrivate).edit);
    length = (int)local_70.d.size;
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar5 = SUB81((this->super_QAbstractSpinBoxPrivate).edit,0);
    QObject::blockSignals(bVar5);
    QLineEdit::setText((this->super_QAbstractSpinBoxPrivate).edit,&local_58);
    bVar1 = QAbstractSpinBoxPrivate::specialValue(&this->super_QAbstractSpinBoxPrivate);
    if (!bVar1) {
      iVar3 = QDateTimeParser::sectionPos((int)this + 0x3d8);
      (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
                (&local_70,this);
      lVar4 = (long)iVar3;
      if (CONCAT44(local_70.d.size._4_4_,(int)local_70.d.size) < (long)iVar3) {
        lVar4 = CONCAT44(local_70.d.size._4_4_,(int)local_70.d.size);
      }
      lVar6 = 0;
      if (0 < lVar4) {
        lVar6 = lVar4;
      }
      if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_00 = (this->super_QAbstractSpinBoxPrivate).edit;
      if (length < 1) {
        QLineEdit::setCursorPosition(this_00,(int)lVar6);
      }
      else {
        QLineEdit::setSelection(this_00,(int)lVar6,length);
      }
    }
    QObject::blockSignals(bVar5);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::updateEdit()
{
    const QString newText = (specialValue() ? specialValueText : textFromValue(value));
    if (newText == displayText())
        return;
    int selsize = edit->selectedText().size();
    const QSignalBlocker blocker(edit);

    edit->setText(newText);

    if (!specialValue()
#ifdef QT_KEYPAD_NAVIGATION
        && !(QApplicationPrivate::keypadNavigationEnabled() && !edit->hasEditFocus())
#endif
            ) {
        int cursor = sectionPos(currentSectionIndex);
        QDTEDEBUG << "cursor is " << cursor << currentSectionIndex;
        cursor = qBound(0, cursor, displayText().size());
        QDTEDEBUG << cursor;
        if (selsize > 0) {
            edit->setSelection(cursor, selsize);
            QDTEDEBUG << cursor << selsize;
        } else {
            edit->setCursorPosition(cursor);
            QDTEDEBUG << cursor;

        }
    }
}